

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseTableNameField(ParserImpl *this)

{
  TokenDetail *pTVar1;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value;
  TokenDetail name;
  int in_stack_0000011c;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_00000120;
  ParserImpl *in_stack_00000128;
  undefined1 in_stack_00000140 [32];
  ParserImpl *in_stack_ffffffffffffff40;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_60;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_58;
  TokenDetail *local_50;
  TableNameField *pTStack_48;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_30;
  String *local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  pTVar1 = NextToken(in_stack_ffffffffffffff40);
  local_30 = pTVar1->field_0;
  local_28 = pTVar1->module_;
  local_20._0_4_ = pTVar1->line_;
  local_20._4_4_ = pTVar1->column_;
  local_18 = *(undefined8 *)&pTVar1->token_;
  NextToken(in_stack_ffffffffffffff40);
  if (*(int *)(in_RSI + 0x20) == 0x3d) {
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff40);
    luna::TokenDetail::TokenDetail((TokenDetail *)&local_60);
    ParseExp(in_stack_00000128,in_stack_00000120,(TokenDetail)in_stack_00000140,in_stack_0000011c);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTStack_48);
    operator_new(0x30);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              (puStack_58,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_60.str_
              );
    luna::TableNameField::TableNameField(pTStack_48,local_50,puStack_58);
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>(puStack_58,(pointer)local_60.str_);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTStack_48);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTStack_48);
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
           in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
           _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  __assert_fail("current_.token_ == \'=\'",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp",
                0x32a,
                "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableNameField()"
               );
}

Assistant:

std::unique_ptr<SyntaxTree> ParseTableNameField()
        {
            TokenDetail name = NextToken();

            NextToken();
            assert(current_.token_ == '=');

            std::unique_ptr<SyntaxTree> value = ParseExp();

            return std::unique_ptr<SyntaxTree>(new TableNameField(name, std::move(value)));
        }